

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteInlineExports(WatWriter *this,ExternalKind kind,Index index)

{
  _Base_ptr p_Var1;
  _Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
  _Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  pVar3;
  key_type local_38;
  
  if (this->options_->inline_export == true) {
    local_38.second = index;
    local_38.first = kind;
    pVar3 = std::
            _Rb_tree<std::pair<wabt::ExternalKind,_unsigned_int>,_std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>,_std::_Select1st<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
            ::equal_range(&(this->inline_export_map_)._M_t,&local_38);
    for (_Var2 = pVar3.first._M_node; _Var2._M_node != pVar3.second._M_node._M_node;
        _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node)) {
      p_Var1 = _Var2._M_node[1]._M_parent;
      WritePuts(this,"(",None);
      WritePuts(this,"export",Space);
      this->indent_ = this->indent_ + 2;
      WriteQuotedData(this,*(void **)p_Var1,(size_t)p_Var1->_M_parent);
      this->next_char_ = None;
      WriteClose(this,Space);
    }
  }
  return;
}

Assistant:

void WatWriter::WriteInlineExports(ExternalKind kind, Index index) {
  if (!options_.inline_export) {
    return;
  }

  auto iter_pair = inline_export_map_.equal_range(std::make_pair(kind, index));
  for (auto iter = iter_pair.first; iter != iter_pair.second; ++iter) {
    const Export* export_ = iter->second;
    WriteOpenSpace("export");
    WriteQuotedString(export_->name, NextChar::None);
    WriteCloseSpace();
  }
}